

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

void __thiscall mkvmuxer::Chapter::Clear(Chapter *this)

{
  char *in_RDI;
  Display *d;
  Display *in_stack_ffffffffffffffe0;
  char **in_stack_fffffffffffffff0;
  
  anon_unknown_12::StrCpy(in_RDI,in_stack_fffffffffffffff0);
  while (0 < *(int *)(in_RDI + 0x2c)) {
    *(int *)(in_RDI + 0x2c) = *(int *)(in_RDI + 0x2c) + -1;
    Display::Clear(in_stack_ffffffffffffffe0);
  }
  if (*(void **)(in_RDI + 0x20) != (void *)0x0) {
    operator_delete__(*(void **)(in_RDI + 0x20));
  }
  in_RDI[0x20] = '\0';
  in_RDI[0x21] = '\0';
  in_RDI[0x22] = '\0';
  in_RDI[0x23] = '\0';
  in_RDI[0x24] = '\0';
  in_RDI[0x25] = '\0';
  in_RDI[0x26] = '\0';
  in_RDI[0x27] = '\0';
  in_RDI[0x28] = '\0';
  in_RDI[0x29] = '\0';
  in_RDI[0x2a] = '\0';
  in_RDI[0x2b] = '\0';
  return;
}

Assistant:

void Chapter::Clear() {
  StrCpy(NULL, &id_);

  while (displays_count_ > 0) {
    Display& d = displays_[--displays_count_];
    d.Clear();
  }

  delete[] displays_;
  displays_ = NULL;

  displays_size_ = 0;
}